

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
fasttext::FastText::getAnalogies
          (vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,FastText *this,int32_t k,string *wordA,string *wordB,
          string *wordC)

{
  Matrix *wordVectors;
  pointer pcVar1;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pvVar2;
  long lVar3;
  real rVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Vector buffer;
  Vector query;
  allocator_type local_102;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_101;
  Vector local_100;
  int32_t local_e4;
  Vector local_e0;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_c8 = __return_storage_ptr__;
  Vector::Vector(&local_e0,
                 (long)((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->dim);
  Vector::zero(&local_e0);
  Vector::Vector(&local_100,
                 (long)((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->dim);
  local_e4 = k;
  getWordVector(this,&local_100,wordA);
  rVar4 = Vector::norm(&local_100);
  Vector::addVector(&local_e0,&local_100,1.0 / (rVar4 + 1e-08));
  getWordVector(this,&local_100,wordB);
  rVar4 = Vector::norm(&local_100);
  Vector::addVector(&local_e0,&local_100,-1.0 / (rVar4 + 1e-08));
  getWordVector(this,&local_100,wordC);
  rVar4 = Vector::norm(&local_100);
  Vector::addVector(&local_e0,&local_100,1.0 / (rVar4 + 1e-08));
  lazyComputeWordVectors(this);
  wordVectors = (this->wordVectors_)._M_t.
                super___uniq_ptr_impl<fasttext::Matrix,_std::default_delete<fasttext::Matrix>_>._M_t
                .super__Tuple_impl<0UL,_fasttext::Matrix_*,_std::default_delete<fasttext::Matrix>_>.
                super__Head_base<0UL,_fasttext::Matrix_*,_false>._M_head_impl;
  if (wordVectors != (Matrix *)0x0) {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    pcVar1 = (wordA->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar1,pcVar1 + wordA->_M_string_length);
    local_a0[0] = local_90;
    pcVar1 = (wordB->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,pcVar1,pcVar1 + wordB->_M_string_length);
    local_80[0] = local_70;
    pcVar1 = (wordC->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,pcVar1,pcVar1 + wordC->_M_string_length);
    __l._M_len = 3;
    __l._M_array = &local_c0;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_60,__l,&local_101,&local_102);
    pvVar2 = local_c8;
    getNN(local_c8,this,wordVectors,&local_e0,local_e4,
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_60);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_60);
    lVar3 = 0;
    do {
      if (local_70 + lVar3 != *(undefined1 **)((long)local_80 + lVar3)) {
        operator_delete(*(undefined1 **)((long)local_80 + lVar3));
      }
      lVar3 = lVar3 + -0x20;
    } while (lVar3 != -0x60);
    if (local_100.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_100.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_e0.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e0.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return pvVar2;
  }
  __assert_fail("wordVectors_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/fasttext.cc"
                ,0x263,
                "std::vector<std::pair<real, std::string>> fasttext::FastText::getAnalogies(int32_t, const std::string &, const std::string &, const std::string &)"
               );
}

Assistant:

std::vector<std::pair<real, std::string>> FastText::getAnalogies(
		int32_t k,
		const std::string& wordA,
		const std::string& wordB,
		const std::string& wordC) {
	Vector query = Vector(args_->dim);
	query.zero();

	Vector buffer(args_->dim);
	getWordVector(buffer, wordA);
	query.addVector(buffer, 1.0 / (buffer.norm() + 1e-8));
	getWordVector(buffer, wordB);
	query.addVector(buffer, -1.0 / (buffer.norm() + 1e-8));
	getWordVector(buffer, wordC);
	query.addVector(buffer, 1.0 / (buffer.norm() + 1e-8));

	lazyComputeWordVectors();
	assert(wordVectors_);
	return getNN(*wordVectors_, query, k, {wordA, wordB, wordC});
}